

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::CalculateEntropy
          (SentencePieceProcessor *this,string_view input,float alpha,float *entropy)

{
  bool bVar1;
  uint uVar2;
  pointer pMVar3;
  StatusBuilder *pSVar4;
  pointer pNVar5;
  size_t sVar6;
  undefined4 *in_R8;
  undefined4 extraout_XMM0_Da;
  undefined1 auVar7 [16];
  undefined1 local_200 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  string normalized;
  StatusBuilder local_1b8;
  undefined4 *local_38;
  float *entropy_local;
  size_t sStack_28;
  float alpha_local;
  SentencePieceProcessor *this_local;
  string_view input_local;
  Status *_status;
  
  this_local = (SentencePieceProcessor *)input._M_str;
  sVar6 = input._M_len;
  local_38 = in_R8;
  entropy_local._4_4_ = alpha;
  sStack_28 = sVar6;
  input_local._M_len = (size_t)entropy;
  input_local._M_str = (char *)this;
  pMVar3 = std::
           unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
           ::operator->((unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
                         *)(sVar6 + 8));
  uVar2 = (*pMVar3->_vptr_ModelInterface[0xd])();
  if ((uVar2 & 1) == 0) {
    util::StatusBuilder::StatusBuilder(&local_1b8,kInternal);
    pSVar4 = util::StatusBuilder::operator<<
                       (&local_1b8,(char (*) [31])"src/sentencepiece_processor.cc");
    pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [2])0x339e65);
    normalized.field_2._8_4_ = 0x2ef;
    pSVar4 = util::StatusBuilder::operator<<(pSVar4,(int *)(normalized.field_2._M_local_buf + 8));
    pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [4])") [");
    pSVar4 = util::StatusBuilder::operator<<
                       (pSVar4,(char (*) [38])"model_->IsCalculateEntropyAvailable()");
    pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [3])"] ");
    util::StatusBuilder::operator<<
              (pSVar4,(char (*) [57])"CalculateEntropy is not available for the current model.");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    util::StatusBuilder::~StatusBuilder(&local_1b8);
  }
  else {
    std::__cxx11::string::string
              ((string *)
               &norm_to_orig.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200);
    pNVar5 = std::
             unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
             ::operator->((unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
                           *)(sVar6 + 0x10));
    (*pNVar5->_vptr_Normalizer[4])
              (this,pNVar5,this_local,input_local._M_len,
               &norm_to_orig.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_200);
    bVar1 = util::Status::ok((Status *)this);
    if (bVar1) {
      util::Status::~Status((Status *)this);
      pMVar3 = std::
               unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
               ::operator->((unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
                             *)(sVar6 + 8));
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)
                          &norm_to_orig.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      (*pMVar3->_vptr_ModelInterface[9])(entropy_local._4_4_,pMVar3,auVar7._0_8_,auVar7._8_8_);
      *local_38 = extraout_XMM0_Da;
      util::OkStatus();
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200);
    std::__cxx11::string::~string
              ((string *)
               &norm_to_orig.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::CalculateEntropy(absl::string_view input,
                                                      float alpha,
                                                      float *entropy) const {
  CHECK_OR_RETURN(model_->IsCalculateEntropyAvailable())
      << "CalculateEntropy is not available for the current model.";
  std::string normalized;
  std::vector<size_t> norm_to_orig;
  RETURN_IF_ERROR(normalizer_->Normalize(input, &normalized, &norm_to_orig));

  *entropy = model_->CalculateEntropy(normalized, alpha);
  return util::OkStatus();
}